

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O3

int Dar_ObjCutLevelAchieved(Vec_Ptr_t *vCut,int nLevelMin)

{
  undefined8 uVar1;
  long lVar2;
  
  if (0 < (long)vCut->nSize) {
    lVar2 = 0;
    do {
      uVar1 = *(undefined8 *)((long)vCut->pArray[lVar2] + 0x18);
      if ((((uint)uVar1 & 7) != 2) && ((int)((uint)((ulong)uVar1 >> 0x20) & 0xffffff) <= nLevelMin))
      {
        return 1;
      }
      lVar2 = lVar2 + 1;
    } while (vCut->nSize != lVar2);
  }
  return 0;
}

Assistant:

int Dar_ObjCutLevelAchieved( Vec_Ptr_t * vCut, int nLevelMin )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
        if ( !Aig_ObjIsCi(pObj) && (int)pObj->Level <= nLevelMin )
            return 1;
    return 0;
}